

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::CommissionerApp::GetPanId
          (Error *__return_storage_ptr__,CommissionerApp *this,uint16_t *aPanId)

{
  bool bVar1;
  uint uVar2;
  element_type *peVar3;
  Error *aError;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar4;
  format_args args;
  format_args args_00;
  string_view fmt;
  string_view fmt_00;
  anon_class_1_0_00000001 local_272;
  v10 local_271;
  v10 *local_270;
  size_t local_268;
  string local_260;
  Error local_240;
  ErrorCode local_214;
  Error local_210;
  anon_class_1_0_00000001 local_1e2;
  v10 local_1e1;
  v10 *local_1e0;
  size_t local_1d8;
  string local_1d0;
  Error local_1b0;
  undefined1 local_171;
  uint16_t *local_170;
  uint16_t *aPanId_local;
  CommissionerApp *this_local;
  Error *error;
  undefined1 local_140 [16];
  v10 *local_130;
  ulong local_128;
  v10 *local_120;
  size_t sStack_118;
  string *local_110;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_108 [2];
  undefined1 local_f8 [16];
  v10 *local_e8;
  ulong local_e0;
  v10 *local_d8;
  size_t sStack_d0;
  string *local_c8;
  v10 *local_c0;
  v10 **local_b8;
  v10 *local_b0;
  v10 **local_a8;
  v10 **local_a0;
  v10 *local_98;
  size_t sStack_90;
  v10 **local_80;
  v10 *local_78;
  size_t sStack_70;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_68;
  undefined1 *local_60;
  Error **local_58;
  undefined1 *local_50;
  Error **local_48;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_40;
  Error **local_38;
  undefined8 local_30;
  undefined1 *local_28;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_20;
  undefined8 local_18;
  undefined1 *local_10;
  
  local_171 = 0;
  local_170 = aPanId;
  aPanId_local = (uint16_t *)this;
  this_local = (CommissionerApp *)__return_storage_ptr__;
  Error::Error(__return_storage_ptr__);
  uVar2 = (*(this->super_CommissionerHandler)._vptr_CommissionerHandler[0xf])();
  if ((uVar2 & 1) == 0) {
    GetPanId::anon_class_1_0_00000001::operator()(&local_1e2);
    local_b8 = &local_1e0;
    local_c0 = &local_1e1;
    bVar4 = ::fmt::v10::operator()(local_c0);
    local_1d8 = bVar4.size_;
    local_1e0 = (v10 *)bVar4.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_c8 = &local_1d0;
    local_d8 = local_1e0;
    sStack_d0 = local_1d8;
    local_a0 = &local_d8;
    local_e8 = local_1e0;
    local_e0 = local_1d8;
    local_98 = local_e8;
    sStack_90 = local_e0;
    local_108[0] = ::fmt::v10::
                   make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_60 = local_f8;
    local_68 = local_108;
    local_18 = 0;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_68;
    fmt.size_ = 0;
    fmt.data_ = (char *)local_e0;
    local_40 = local_68;
    local_20 = local_68;
    local_10 = local_60;
    ::fmt::v10::vformat_abi_cxx11_(&local_1d0,local_e8,fmt,args);
    Error::Error(&local_1b0,kInvalidState,&local_1d0);
    Error::operator=(__return_storage_ptr__,&local_1b0);
    Error::~Error(&local_1b0);
    std::__cxx11::string::~string((string *)&local_1d0);
  }
  else {
    peVar3 = std::
             __shared_ptr_access<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->mCommissioner);
    (*peVar3->_vptr_Commissioner[0x1a])(&local_210,peVar3,&this->mActiveDataset,0xffff);
    aError = Error::operator=(__return_storage_ptr__,&local_210);
    local_214 = kNone;
    bVar1 = commissioner::operator!=(aError,&local_214);
    Error::~Error(&local_210);
    if (!bVar1) {
      if (((this->mActiveDataset).mPresentFlags & 0x100) == 0) {
        GetPanId::anon_class_1_0_00000001::operator()(&local_272);
        local_a8 = &local_270;
        local_b0 = &local_271;
        bVar4 = ::fmt::v10::operator()(local_b0);
        local_268 = bVar4.size_;
        local_270 = (v10 *)bVar4.data_;
        ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
        local_110 = &local_260;
        local_120 = local_270;
        sStack_118 = local_268;
        local_80 = &local_120;
        local_130 = local_270;
        local_128 = local_268;
        local_78 = local_130;
        sStack_70 = local_128;
        error = (Error *)::fmt::v10::
                         make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>()
        ;
        local_50 = local_140;
        local_58 = &error;
        local_30 = 0;
        args_00.field_1.values_ = in_R9.values_;
        args_00.desc_ = (unsigned_long_long)local_58;
        fmt_00.size_ = 0;
        fmt_00.data_ = (char *)local_128;
        local_48 = local_58;
        local_38 = local_58;
        local_28 = local_50;
        ::fmt::v10::vformat_abi_cxx11_(&local_260,local_130,fmt_00,args_00);
        Error::Error(&local_240,kNotFound,&local_260);
        Error::operator=(__return_storage_ptr__,&local_240);
        Error::~Error(&local_240);
        std::__cxx11::string::~string((string *)&local_260);
      }
      else {
        *local_170 = (this->mActiveDataset).mPanId;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::GetPanId(uint16_t &aPanId)
{
    Error error;

    VerifyOrExit(IsActive(), error = ERROR_INVALID_STATE("the commissioner is not active"));

    SuccessOrExit(error = mCommissioner->GetActiveDataset(mActiveDataset, 0xFFFF));

    VerifyOrExit(mActiveDataset.mPresentFlags & ActiveOperationalDataset::kPanIdBit,
                 error = ERROR_NOT_FOUND("cannot find valid PAN ID in Active Operational Dataset"));
    aPanId = mActiveDataset.mPanId;

exit:
    return error;
}